

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O3

void VisitNestedScopes<ParseNodeVisitor<ApplyCheck>,ParseNodeVisitor<ApplyCheck>>
               (ParseNode *pnodeScopeList,ParseNode *pnodeParent,
               ByteCodeGenerator *byteCodeGenerator,ParseNodeVisitor<ApplyCheck> prefix,
               ParseNodeVisitor<ApplyCheck> postfix,uint *pIndex,bool breakOnBodyScope)

{
  OpCode OVar1;
  uint index;
  ParseNode *pnode;
  NestedArray *pNVar2;
  NestedArray this;
  FuncInfo *pFVar3;
  Scope *innerScope;
  Scope *innerScope_00;
  FunctionInfo *nestedFunc;
  code *pcVar4;
  ParseNodeVisitor<ApplyCheck> postfix_00;
  ParseNodeVisitor<ApplyCheck> postfix_01;
  ParseNodeVisitor<ApplyCheck> postfix_02;
  ParseNodeVisitor<ApplyCheck> postfix_03;
  ParseNodeVisitor<ApplyCheck> postfix_04;
  ParseNodeVisitor<ApplyCheck> postfix_05;
  ParseNodeVisitor<ApplyCheck> postfix_06;
  ParseNodeVisitor<ApplyCheck> postfix_07;
  ParseNodeVisitor<ApplyCheck> postfix_08;
  anon_class_24_3_9710772a fn;
  anon_class_24_3_9710772a fn_00;
  ParseNodeVisitor<ApplyCheck> prefix_00;
  ParseNodeVisitor<ApplyCheck> prefix_01;
  ParseNodeVisitor<ApplyCheck> prefix_02;
  ParseNodeVisitor<ApplyCheck> prefix_03;
  ParseNodeVisitor<ApplyCheck> prefix_04;
  ParseNodeVisitor<ApplyCheck> prefix_05;
  ParseNodeVisitor<ApplyCheck> prefix_06;
  ParseNodeVisitor<ApplyCheck> prefix_07;
  ParseNodeVisitor<ApplyCheck> prefix_08;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_ApplyCheck_ptr *p_Var5;
  ByteCodeGenerator *pBVar6;
  byte bVar7;
  bool bVar8;
  charcount_t cVar9;
  Type TVar10;
  uint uVar11;
  ParseNodeFnc *pPVar12;
  ParseNodeBlock *pPVar13;
  ParseNodeCatch *pnodeCatch;
  FunctionBody *pFVar14;
  ParseNodeWith *pPVar15;
  ParseNodeBlock *pPVar16;
  ParseNodeBin *pPVar17;
  FunctionProxy *this_00;
  Type TVar18;
  ParseNodePtr this_01;
  ByteCodeGenerator **ppBStack_90;
  bool isMergedScope;
  ParseNodeVisitor<ApplyCheck> *local_80;
  ParseNode *local_78;
  ParseableFunctionInfo *local_70;
  FuncInfo *local_68;
  uint local_5c;
  FunctionBody *pFStack_58;
  uint i;
  ApplyCheck *local_50;
  ParseNodeVisitor<ApplyCheck> prefix_local;
  ByteCodeGenerator *local_38;
  ByteCodeGenerator *byteCodeGenerator_local;
  
  prefix_local.m_context = (ApplyCheck *)prefix.m_fn;
  local_50 = prefix.m_context;
  local_38 = byteCodeGenerator;
  pPVar12 = ParseNode::AsParseNodeFnc(pnodeParent);
  local_68 = pPVar12->funcInfo;
  local_70 = local_68->byteCodeFunction;
  local_5c = 0;
  if (pnodeScopeList != (ParseNode *)0x0) {
    pFStack_58 = byteCodeGenerator->pCurrentFunction;
    prefix_local.m_fn =
         (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_ApplyCheck_ptr *)
         __tls_get_addr(&PTR_01548f08);
    local_78 = pnodeParent;
    do {
      if ((breakOnBodyScope) &&
         (pPVar12 = ParseNode::AsParseNodeFnc(pnodeParent),
         (ParseNodeBlock *)pnodeScopeList == pPVar12->pnodeBodyScope)) {
        return;
      }
      OVar1 = (((ParseNodeBlock *)pnodeScopeList)->super_ParseNodeStmt).super_ParseNode.nop;
      if (OVar1 < knopWith) {
        if (OVar1 == knopFncDecl) {
          pPVar12 = ParseNode::AsParseNodeFnc(pnodeScopeList);
          pBVar6 = local_38;
          if (pFStack_58 != (FunctionBody *)0x0) {
            bVar8 = Js::ScriptContext::IsScriptContextInNonDebugMode(local_38->scriptContext);
            if ((bVar8) || ((pBVar6->m_utf8SourceInfo->field_0xa8 & 4) != 0)) {
              if (((local_70->super_FunctionProxy).field_0x46 & 0x10) == 0) {
LAB_008353b1:
                pFVar14 = (FunctionBody *)0x0;
                goto LAB_008353b3;
              }
            }
            else if ((((local_70->super_FunctionProxy).field_0x46 & 0x10) == 0) ==
                     (((pFStack_58->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46 &
                      0x10) == 0)) {
              cVar9 = Js::ParseableFunctionInfo::StartInDocument
                                (&pFStack_58->super_ParseableFunctionInfo);
              if (cVar9 != pnodeParent->ichMin) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                p_Var5 = prefix_local.m_fn;
                *(undefined4 *)prefix_local.m_fn = 1;
                bVar8 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                                   ,0xd07,
                                   "(pLastReuseFunc->StartInDocument() == pnodeParent->ichMin)",
                                   "pLastReuseFunc->StartInDocument() == pnodeParent->ichMin");
                if (!bVar8) goto LAB_00835a7b;
                *(undefined4 *)p_Var5 = 0;
                cVar9 = pnodeParent->ichMin;
              }
              if ((pFStack_58->super_ParseableFunctionInfo).m_cchLength !=
                  pnodeParent->ichLim - cVar9) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                p_Var5 = prefix_local.m_fn;
                *(undefined4 *)prefix_local.m_fn = 1;
                bVar8 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                                   ,0xd08,
                                   "(pLastReuseFunc->LengthInChars() == pnodeParent->LengthInCodepoints())"
                                   ,
                                   "pLastReuseFunc->LengthInChars() == pnodeParent->LengthInCodepoints()"
                                  );
                if (!bVar8) goto LAB_00835a7b;
                *(undefined4 *)p_Var5 = 0;
              }
              pNVar2 = (pFStack_58->super_ParseableFunctionInfo).nestedArray.ptr;
              TVar10 = 0;
              TVar18 = 0;
              if (pNVar2 != (NestedArray *)0x0) {
                TVar18 = pNVar2->nestedCount;
              }
              pNVar2 = (local_70->nestedArray).ptr;
              if (pNVar2 != (NestedArray *)0x0) {
                TVar10 = pNVar2->nestedCount;
              }
              if (TVar18 != TVar10) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                p_Var5 = prefix_local.m_fn;
                *(undefined4 *)prefix_local.m_fn = 1;
                bVar8 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                                   ,0xd09,
                                   "(pLastReuseFunc->GetNestedCount() == parentFunc->GetNestedCount())"
                                   ,
                                   "pLastReuseFunc->GetNestedCount() == parentFunc->GetNestedCount()"
                                  );
                if (!bVar8) goto LAB_00835a7b;
                *(undefined4 *)p_Var5 = 0;
              }
              pFVar14 = (FunctionBody *)
                        Js::ParseableFunctionInfo::GetNestedFunctionProxy
                                  (&pFStack_58->super_ParseableFunctionInfo,*pIndex);
              if ((pFVar14 == (FunctionBody *)0x0) ||
                 (bVar8 = Js::FunctionProxy::IsFunctionBody((FunctionProxy *)pFVar14), !bVar8))
              goto LAB_008353b1;
              bVar8 = Js::FunctionProxy::IsFunctionBody((FunctionProxy *)pFVar14);
              if (!bVar8) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                p_Var5 = prefix_local.m_fn;
                *(undefined4 *)prefix_local.m_fn = 1;
                bVar8 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                   ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
                if (!bVar8) goto LAB_00835a7b;
                *(undefined4 *)p_Var5 = 0;
              }
LAB_008353b3:
              local_38->pCurrentFunction = pFVar14;
            }
          }
          pNVar2 = (local_70->nestedArray).ptr;
          if (pNVar2 == (NestedArray *)0x0) {
LAB_00835501:
            pFVar14 = (FunctionBody *)0x0;
          }
          else {
            uVar11 = *pIndex;
            if (pNVar2->nestedCount <= uVar11) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              p_Var5 = prefix_local.m_fn;
              *(undefined4 *)prefix_local.m_fn = 1;
              bVar8 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                                 ,0xd23,"(*pIndex < parentNestedArray->nestedCount)",
                                 "*pIndex < parentNestedArray->nestedCount");
              if (!bVar8) goto LAB_00835a7b;
              *(undefined4 *)p_Var5 = 0;
              uVar11 = *pIndex;
            }
            this = pNVar2[(ulong)uVar11 + 1];
            if ((this == (NestedArray)0x0) ||
               (((Type *)((long)this + 8))->ptr == (FunctionProxy *)0x0)) goto LAB_00835501;
            pFVar14 = (FunctionBody *)0x0;
            if ((*(Type *)((long)this + 0x18) & DeferredDeserialize) == None) {
              pFVar14 = (FunctionBody *)
                        Js::FunctionInfo::GetParseableFunctionInfo((FunctionInfo *)this);
              pBVar6 = local_38;
              bVar8 = Js::ScriptContext::IsScriptContextInNonDebugMode(local_38->scriptContext);
              pnodeParent = local_78;
              if ((((!bVar8) && ((pBVar6->m_utf8SourceInfo->field_0xa8 & 4) == 0)) &&
                  (local_38->pCurrentFunction == (FunctionBody *)0x0)) &&
                 (bVar8 = Js::FunctionProxy::IsFunctionBody((FunctionProxy *)pFVar14), bVar8)) {
                bVar8 = Js::FunctionProxy::IsFunctionBody((FunctionProxy *)pFVar14);
                if (!bVar8) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  p_Var5 = prefix_local.m_fn;
                  *(undefined4 *)prefix_local.m_fn = 1;
                  bVar8 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                     ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
                  if (!bVar8) goto LAB_00835a7b;
                  *(undefined4 *)p_Var5 = 0;
                }
                local_38->pCurrentFunction = pFVar14;
              }
            }
          }
          PreVisitFunction(pPVar12,local_38,&pFVar14->super_ParseableFunctionInfo);
          pFVar3 = pPVar12->funcInfo;
          FuncInfo::OnStartVisitFunction(local_68,pPVar12);
          pBVar6 = local_38;
          if (pPVar12->pnodeBody == (ParseNodePtr)0x0) {
LAB_008358ed:
            ByteCodeGenerator::PushScope(local_38,pFVar3->paramScope);
            ByteCodeGenerator::PushScope(local_38,pFVar3->bodyScope);
          }
          else {
            bVar8 = Js::ScriptContext::IsScriptContextInNonDebugMode(local_38->scriptContext);
            if ((((!bVar8) && (pFStack_58 != (FunctionBody *)0x0)) &&
                (((pBVar6->m_utf8SourceInfo->field_0xa8 & 4) == 0 &&
                 ((local_38->pCurrentFunction == (FunctionBody *)0x0 &&
                  (this_00 = Js::ParseableFunctionInfo::GetNestedFunctionProxy
                                       (&pFStack_58->super_ParseableFunctionInfo,*pIndex),
                  this_00 != (FunctionProxy *)0x0)))))) &&
               (bVar8 = Js::FunctionProxy::IsFunctionBody(this_00), !bVar8)) {
              pFVar14 = (FunctionBody *)pFVar3->byteCodeFunction;
              bVar8 = Js::FunctionProxy::IsFunctionBody((FunctionProxy *)pFVar14);
              if (!bVar8) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                p_Var5 = prefix_local.m_fn;
                *(undefined4 *)prefix_local.m_fn = 1;
                bVar8 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                   ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
                if (!bVar8) goto LAB_00835a7b;
                *(undefined4 *)p_Var5 = 0;
              }
              Js::FunctionProxy::UpdateFunctionBodyImpl(this_00,pFVar14);
            }
            innerScope = pFVar3->paramScope;
            innerScope_00 = pFVar3->bodyScope;
            BeginVisitBlock(pPVar12->pnodeScopes,local_38);
            local_5c = 0;
            pPVar13 = pPVar12->pnodeScopes;
            ByteCodeGenerator::PushScope(local_38,innerScope);
            if (((pPVar12->fncFlags & kFunctionHasNonSimpleParameterList) != kFunctionNone) &&
               ((pFVar3->field_0xb5 & 0x80) == 0)) {
              pFVar3->currentChildScope = innerScope;
              if (((pPVar13->super_ParseNodeStmt).super_ParseNode.nop != knopBlock) ||
                 (pPVar16 = ParseNode::AsParseNodeBlock((ParseNode *)pPVar13),
                 (~pPVar16->field_0x5c & 3) != 0)) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                p_Var5 = prefix_local.m_fn;
                *(undefined4 *)prefix_local.m_fn = 1;
                bVar8 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                                   ,0xd54,
                                   "(containerScope->nop == knopBlock && containerScope->AsParseNodeBlock()->blockType == Parameter)"
                                   ,
                                   "containerScope->nop == knopBlock && containerScope->AsParseNodeBlock()->blockType == Parameter"
                                  );
                if (!bVar8) goto LAB_00835a7b;
                *(undefined4 *)p_Var5 = 0;
              }
              pPVar16 = ParseNode::AsParseNodeBlock((ParseNode *)pPVar13);
              prefix_04.m_fn =
                   (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_ApplyCheck_ptr *)
                   prefix_local.m_context;
              prefix_04.m_context = local_50;
              postfix_06.m_fn = postfix.m_fn;
              postfix_06.m_context = postfix.m_context;
              VisitNestedScopes<ParseNodeVisitor<ApplyCheck>,ParseNodeVisitor<ApplyCheck>>
                        (pPVar16->pnodeScopes,&pPVar12->super_ParseNode,local_38,prefix_04,
                         postfix_06,&local_5c,true);
              ppBStack_90 = &local_38;
              _isMergedScope = &local_50;
              fn.prefix = (ParseNodeVisitor<ApplyCheck> *)_isMergedScope;
              fn.byteCodeGenerator = ppBStack_90;
              fn.postfix._0_4_ = (int)&postfix;
              fn.postfix._4_4_ = (int)((ulong)&postfix >> 0x20);
              local_80 = &postfix;
              MapFormalsImpl<VisitNestedScopes<ParseNodeVisitor<ApplyCheck>,ParseNodeVisitor<ApplyCheck>>(ParseNode*,ParseNode*,ByteCodeGenerator*,ParseNodeVisitor<ApplyCheck>,ParseNodeVisitor<ApplyCheck>,unsigned_int*,bool)::_lambda(ParseNode*)_1_,true>
                        (pPVar12,fn);
            }
            ByteCodeGenerator::PushScope(local_38,innerScope_00);
            pFVar3->currentChildScope = innerScope_00;
            PreVisitBlock(pPVar12->pnodeBodyScope,local_38);
            AddVarsToScope(pPVar12->pnodeVars,local_38);
            pnodeParent = local_78;
            if (((pPVar12->fncFlags & kFunctionHasNonSimpleParameterList) == kFunctionNone) ||
               ((pFVar3->field_0xb5 & 0x80) != 0)) {
              prefix_05.m_fn =
                   (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_ApplyCheck_ptr *)
                   prefix_local.m_context;
              prefix_05.m_context = local_50;
              postfix_07.m_fn = postfix.m_fn;
              postfix_07.m_context = postfix.m_context;
              VisitNestedScopes<ParseNodeVisitor<ApplyCheck>,ParseNodeVisitor<ApplyCheck>>
                        ((ParseNode *)pPVar13,&pPVar12->super_ParseNode,local_38,prefix_05,
                         postfix_07,&local_5c,false);
              ppBStack_90 = &local_38;
              _isMergedScope = &local_50;
              fn_00.prefix = (ParseNodeVisitor<ApplyCheck> *)_isMergedScope;
              fn_00.byteCodeGenerator = ppBStack_90;
              fn_00.postfix._0_4_ = (int)&postfix;
              fn_00.postfix._4_4_ = (int)((ulong)&postfix >> 0x20);
              local_80 = &postfix;
              MapFormalsImpl<VisitNestedScopes<ParseNodeVisitor<ApplyCheck>,ParseNodeVisitor<ApplyCheck>>(ParseNode*,ParseNode*,ByteCodeGenerator*,ParseNodeVisitor<ApplyCheck>,ParseNodeVisitor<ApplyCheck>,unsigned_int*,bool)::_lambda(ParseNode*)_2_,true>
                        (pPVar12,fn_00);
              if ((pPVar12->fncFlags & kFunctionHasNonSimpleParameterList) != kFunctionNone)
              goto LAB_00835731;
            }
            else {
LAB_00835731:
              ByteCodeGenerator::AssignUndefinedConstRegister(local_38);
              if ((pFVar3->field_0xb5 & 0x80) == 0) {
                pPVar13 = pPVar12->pnodeBodyScope;
                if (pPVar13->scope == (Scope *)0x0) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  p_Var5 = prefix_local.m_fn;
                  *(undefined4 *)prefix_local.m_fn = 1;
                  bVar8 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                                     ,0xd6c,"(pnodeFnc->pnodeBodyScope->scope)",
                                     "pnodeFnc->pnodeBodyScope->scope");
                  if (!bVar8) {
LAB_00835a7b:
                    pcVar4 = (code *)invalidInstructionException();
                    (*pcVar4)();
                  }
                  *(undefined4 *)p_Var5 = 0;
                  pPVar13 = pPVar12->pnodeBodyScope;
                }
                prefix_06.m_fn =
                     (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_ApplyCheck_ptr *)
                     prefix_local.m_context;
                prefix_06.m_context = local_50;
                postfix_08.m_fn = postfix.m_fn;
                postfix_08.m_context = postfix.m_context;
                VisitNestedScopes<ParseNodeVisitor<ApplyCheck>,ParseNodeVisitor<ApplyCheck>>
                          (pPVar13->pnodeScopes,&pPVar12->super_ParseNode,local_38,prefix_06,
                           postfix_08,&local_5c,false);
              }
            }
            BeginVisitBlock(pPVar12->pnodeBodyScope,local_38);
            this_01 = pPVar12->pnodeBody;
            while (pBVar6 = local_38, this_01->nop == knopList) {
              pPVar17 = ParseNode::AsParseNodeBin(this_01);
              pBVar6->currentTopStatement = pPVar17->pnode1;
              pPVar17 = ParseNode::AsParseNodeBin(this_01);
              prefix_07.m_fn =
                   (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_ApplyCheck_ptr *)
                   prefix_local.m_context;
              prefix_07.m_context = local_50;
              postfix_01.m_fn = postfix.m_fn;
              postfix_01.m_context = postfix.m_context;
              Visit<ParseNodeVisitor<ApplyCheck>,ParseNodeVisitor<ApplyCheck>>
                        (pPVar17->pnode1,local_38,prefix_07,postfix_01,(ParseNode *)0x0);
              if ((pFVar3->field_0xb4 & 6) == 0) {
                bVar7 = local_38->m_utf8SourceInfo->field_0xa8;
                if ((local_38->m_utf8SourceInfo->debugModeSource).ptr == (uchar *)0x0 &&
                    (bVar7 & 0x20) == 0) {
                  bVar7 = 0;
                }
                else {
                  bVar7 = (bVar7 & 0x40) >> 6;
                }
                if ((bVar7 == 0) && ((DAT_015933d1 & 1) == 0)) {
                  pPVar17 = ParseNode::AsParseNodeBin(this_01);
                  MarkInit(pPVar17->pnode1);
                }
              }
              pPVar17 = ParseNode::AsParseNodeBin(this_01);
              this_01 = pPVar17->pnode2;
            }
            local_38->currentTopStatement = this_01;
            prefix_08.m_fn =
                 (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_ApplyCheck_ptr *)
                 prefix_local.m_context;
            prefix_08.m_context = local_50;
            postfix_02.m_fn = postfix.m_fn;
            postfix_02.m_context = postfix.m_context;
            Visit<ParseNodeVisitor<ApplyCheck>,ParseNodeVisitor<ApplyCheck>>
                      (this_01,local_38,prefix_08,postfix_02,(ParseNode *)0x0);
            EndVisitBlock(pPVar12->pnodeBodyScope,local_38);
            EndVisitBlock(pPVar12->pnodeScopes,local_38);
            if (pPVar12->pnodeBody == (ParseNodePtr)0x0) goto LAB_008358ed;
          }
          uVar11 = local_38->flags;
          bVar8 = FuncInfo::IsGlobalFunction(local_68);
          if ((!bVar8) || ((uVar11 & 0x1000) != 0)) {
            index = *pIndex;
            pPVar12->nestedIndex = index;
            nestedFunc = (pFVar3->byteCodeFunction->super_FunctionProxy).functionInfo.ptr;
            *pIndex = index + 1;
            Js::ParseableFunctionInfo::SetNestedFunc(local_70,nestedFunc,index,local_38->flags);
          }
          FuncInfo::OnEndVisitFunction(local_68,pPVar12);
          PostVisitFunction(pPVar12,local_38);
          pnodeScopeList = pPVar12->pnodeNext;
          local_38->pCurrentFunction = pFStack_58;
        }
        else {
          if (OVar1 != knopBlock) {
LAB_00835a28:
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            p_Var5 = prefix_local.m_fn;
            *(undefined4 *)prefix_local.m_fn = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                               ,0xdd5,"(false)","Unexpected opcode in tree of scopes");
            if (bVar8) {
              *(undefined4 *)p_Var5 = 0;
              return;
            }
            goto LAB_00835a7b;
          }
          pPVar13 = ParseNode::AsParseNodeBlock(pnodeScopeList);
          PreVisitBlock(pPVar13,local_38);
          pFVar3 = local_68;
          FuncInfo::OnStartVisitScope(local_68,pPVar13->scope,(bool *)&ppBStack_90);
          prefix_00.m_fn =
               (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_ApplyCheck_ptr *)
               prefix_local.m_context;
          prefix_00.m_context = local_50;
          postfix_03.m_fn = postfix.m_fn;
          postfix_03.m_context = postfix.m_context;
          VisitNestedScopes<ParseNodeVisitor<ApplyCheck>,ParseNodeVisitor<ApplyCheck>>
                    (pPVar13->pnodeScopes,pnodeParent,local_38,prefix_00,postfix_03,pIndex,false);
          FuncInfo::OnEndVisitScope(pFVar3,pPVar13->scope,ppBStack_90._0_1_);
          PostVisitBlock(pPVar13,local_38);
          pPVar13 = ParseNode::AsParseNodeBlock(pnodeScopeList);
          pnodeScopeList = pPVar13->pnodeNext;
        }
      }
      else if (OVar1 == knopWith) {
        PreVisitWith(pnodeScopeList,local_38);
        pPVar15 = ParseNode::AsParseNodeWith(pnodeScopeList);
        pFVar3 = local_68;
        FuncInfo::OnStartVisitScope(local_68,pPVar15->scope,(bool *)&ppBStack_90);
        pPVar15 = ParseNode::AsParseNodeWith(pnodeScopeList);
        prefix_03.m_fn =
             (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_ApplyCheck_ptr *)prefix_local.m_context
        ;
        prefix_03.m_context = local_50;
        postfix_05.m_fn = postfix.m_fn;
        postfix_05.m_context = postfix.m_context;
        VisitNestedScopes<ParseNodeVisitor<ApplyCheck>,ParseNodeVisitor<ApplyCheck>>
                  (pPVar15->pnodeScopes,pnodeParent,local_38,prefix_03,postfix_05,pIndex,false);
        pPVar15 = ParseNode::AsParseNodeWith(pnodeScopeList);
        FuncInfo::OnEndVisitScope(pFVar3,pPVar15->scope,ppBStack_90._0_1_);
        ByteCodeGenerator::PopScope(local_38);
        pPVar15 = ParseNode::AsParseNodeWith(pnodeScopeList);
        pnodeScopeList = pPVar15->pnodeNext;
      }
      else {
        if (OVar1 != knopCatch) goto LAB_00835a28;
        pnodeCatch = ParseNode::AsParseNodeCatch(pnodeScopeList);
        PreVisitCatch(pnodeCatch,local_38);
        pnode = pnodeCatch->pnodeParam;
        if ((pnode != (ParseNode *)0x0) && (pnode->nop != knopParamPattern)) {
          prefix_01.m_fn =
               (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_ApplyCheck_ptr *)
               prefix_local.m_context;
          prefix_01.m_context = local_50;
          postfix_00.m_fn = postfix.m_fn;
          postfix_00.m_context = postfix.m_context;
          Visit<ParseNodeVisitor<ApplyCheck>,ParseNodeVisitor<ApplyCheck>>
                    (pnode,local_38,prefix_01,postfix_00,(ParseNode *)0x0);
        }
        pFVar3 = local_68;
        FuncInfo::OnStartVisitScope(local_68,pnodeCatch->scope,(bool *)&ppBStack_90);
        prefix_02.m_fn =
             (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_ApplyCheck_ptr *)prefix_local.m_context
        ;
        prefix_02.m_context = local_50;
        postfix_04.m_fn = postfix.m_fn;
        postfix_04.m_context = postfix.m_context;
        VisitNestedScopes<ParseNodeVisitor<ApplyCheck>,ParseNodeVisitor<ApplyCheck>>
                  (pnodeCatch->pnodeScopes,pnodeParent,local_38,prefix_02,postfix_04,pIndex,false);
        FuncInfo::OnEndVisitScope(pFVar3,pnodeCatch->scope,ppBStack_90._0_1_);
        PostVisitCatch((ParseNode *)pnodeCatch,local_38);
        pnodeScopeList = pnodeCatch->pnodeNext;
      }
    } while ((ParseNodeBlock *)pnodeScopeList != (ParseNodeBlock *)0x0);
  }
  return;
}

Assistant:

void VisitNestedScopes(ParseNode* pnodeScopeList, ParseNode* pnodeParent, ByteCodeGenerator* byteCodeGenerator,
    PrefixFn prefix, PostfixFn postfix, uint *pIndex, bool breakOnBodyScope = false)
{
    // Visit all scopes nested in this scope before visiting this function's statements. This way we have all the
    // attributes of all the inner functions before we assign registers within this function.
    // All the attributes we need to propagate downward should already be recorded by the parser.
    // - call to "eval()"
    // - nested in "with"
    FuncInfo * parentFuncInfo = pnodeParent->AsParseNodeFnc()->funcInfo;
    Js::ParseableFunctionInfo* parentFunc = parentFuncInfo->byteCodeFunction;
    ParseNode* pnodeScope;
    uint i = 0;

    // Cache to restore it back once we come out of current function.
    Js::FunctionBody * pLastReuseFunc = byteCodeGenerator->pCurrentFunction;

    for (pnodeScope = pnodeScopeList; pnodeScope;)
    {
        if (breakOnBodyScope && pnodeScope == pnodeParent->AsParseNodeFnc()->pnodeBodyScope)
        {
            break;
        }

        switch (pnodeScope->nop)
        {
        case knopFncDecl:
        {
            ParseNodeFnc * pnodeFnc = pnodeScope->AsParseNodeFnc();
            if (pLastReuseFunc)
            {
                if (!byteCodeGenerator->IsInNonDebugMode())
                {
                    // Here we are trying to match the inner sub-tree as well with already created inner function.

                    if ((pLastReuseFunc->GetIsGlobalFunc() && parentFunc->GetIsGlobalFunc())
                        || (!pLastReuseFunc->GetIsGlobalFunc() && !parentFunc->GetIsGlobalFunc()))
                    {
                        Assert(pLastReuseFunc->StartInDocument() == pnodeParent->ichMin);
                        Assert(pLastReuseFunc->LengthInChars() == pnodeParent->LengthInCodepoints());
                        Assert(pLastReuseFunc->GetNestedCount() == parentFunc->GetNestedCount());

                        // If the current function is not parsed yet, its function body is not generated yet.
                        // Reset pCurrentFunction to null so that it will not be able re-use anything.
                        Js::FunctionProxy* proxy = pLastReuseFunc->GetNestedFunctionProxy((*pIndex));
                        if (proxy && proxy->IsFunctionBody())
                        {
                            byteCodeGenerator->pCurrentFunction = proxy->GetFunctionBody();
                        }
                        else
                        {
                            byteCodeGenerator->pCurrentFunction = nullptr;
                        }
                    }
                }
                else if (!parentFunc->GetIsGlobalFunc())
                {
                    // In the deferred parsing mode, we will be reusing the only one function (which is asked when on ::Begin) all inner function will be created.
                    byteCodeGenerator->pCurrentFunction = nullptr;
                }
            }

            Js::ParseableFunctionInfo::NestedArray * parentNestedArray = parentFunc->GetNestedArray();
            Js::ParseableFunctionInfo* reuseNestedFunc = nullptr;
            if (parentNestedArray)
            {
                Assert(*pIndex < parentNestedArray->nestedCount);
                Js::FunctionInfo * info = parentNestedArray->functionInfoArray[*pIndex];
                if (info && info->HasParseableInfo())
                {
                    reuseNestedFunc = info->GetParseableFunctionInfo();

                    // If parentFunc was redeferred, try to set pCurrentFunction to this FunctionBody,
                    // and cleanup to reparse (as previous cleanup stops at redeferred parentFunc).
                    if (!byteCodeGenerator->IsInNonDebugMode()
                        && !byteCodeGenerator->pCurrentFunction
                        && reuseNestedFunc->IsFunctionBody())
                    {
                        byteCodeGenerator->pCurrentFunction = reuseNestedFunc->GetFunctionBody();
                    }
                }
            }
            PreVisitFunction(pnodeFnc, byteCodeGenerator, reuseNestedFunc);
            FuncInfo *funcInfo = pnodeFnc->funcInfo;

            parentFuncInfo->OnStartVisitFunction(pnodeFnc);

            if (pnodeFnc->pnodeBody)
            {
                if (!byteCodeGenerator->IsInNonDebugMode() && pLastReuseFunc != nullptr && byteCodeGenerator->pCurrentFunction == nullptr)
                {
                    // Patch current non-parsed function's FunctionBodyImpl with the new generated function body.
                    // So that the function object (pointing to the old function body) can able to get to the new one.

                    Js::FunctionProxy* proxy = pLastReuseFunc->GetNestedFunctionProxy((*pIndex));
                    if (proxy && !proxy->IsFunctionBody())
                    {
                        proxy->UpdateFunctionBodyImpl(funcInfo->byteCodeFunction->GetFunctionBody());
                    }
                }

                Scope *paramScope = funcInfo->GetParamScope();
                Scope *bodyScope = funcInfo->GetBodyScope();

                BeginVisitBlock(pnodeFnc->pnodeScopes, byteCodeGenerator);
                i = 0;
                ParseNodePtr containerScope = pnodeFnc->pnodeScopes;

                // Push the param scope
                byteCodeGenerator->PushScope(paramScope);

                if (pnodeFnc->HasNonSimpleParameterList() && !funcInfo->IsBodyAndParamScopeMerged())
                {
                    // Set param scope as the current child scope.
                    funcInfo->SetCurrentChildScope(paramScope);
                    Assert(containerScope->nop == knopBlock && containerScope->AsParseNodeBlock()->blockType == Parameter);
                    VisitNestedScopes(containerScope->AsParseNodeBlock()->pnodeScopes, pnodeFnc, byteCodeGenerator, prefix, postfix, &i, true);
                    MapFormals(pnodeFnc, [&](ParseNode *argNode) { Visit(argNode, byteCodeGenerator, prefix, postfix); });
                }

                // Push the body scope
                byteCodeGenerator->PushScope(bodyScope);
                funcInfo->SetCurrentChildScope(bodyScope);

                PreVisitBlock(pnodeFnc->pnodeBodyScope, byteCodeGenerator);
                AddVarsToScope(pnodeFnc->pnodeVars, byteCodeGenerator);

                if (!pnodeFnc->HasNonSimpleParameterList() || funcInfo->IsBodyAndParamScopeMerged())
                {
                    VisitNestedScopes(containerScope, pnodeFnc, byteCodeGenerator, prefix, postfix, &i);
                    MapFormals(pnodeFnc, [&](ParseNode *argNode) { Visit(argNode, byteCodeGenerator, prefix, postfix); });
                }

                if (pnodeFnc->HasNonSimpleParameterList())
                {
                    byteCodeGenerator->AssignUndefinedConstRegister();

                    if (!funcInfo->IsBodyAndParamScopeMerged())
                    {
                        Assert(pnodeFnc->pnodeBodyScope->scope);
                        VisitNestedScopes(pnodeFnc->pnodeBodyScope->pnodeScopes, pnodeFnc, byteCodeGenerator, prefix, postfix, &i);
                    }
                }

                BeginVisitBlock(pnodeFnc->pnodeBodyScope, byteCodeGenerator);

                ParseNode* pnode = pnodeFnc->pnodeBody;
                while (pnode->nop == knopList)
                {
                    // Check to see whether initializations of locals to "undef" can be skipped.
                    // The logic to do this is cheap - omit the init if we see an init with a value
                    // on the RHS at the top statement level (i.e., not inside a block, try, loop, etc.)
                    // before we see a use. The motivation is to help identify single-def locals in the BE.
                    // Note that this can't be done for globals.
                    byteCodeGenerator->SetCurrentTopStatement(pnode->AsParseNodeBin()->pnode1);
                    Visit(pnode->AsParseNodeBin()->pnode1, byteCodeGenerator, prefix, postfix);
                    if (!funcInfo->GetCallsEval() && !funcInfo->GetChildCallsEval() &&
                        // So that it will not be marked as init thus it will be added to the diagnostics symbols container.
                        !(byteCodeGenerator->ShouldTrackDebuggerMetadata()))
                    {
                        MarkInit(pnode->AsParseNodeBin()->pnode1);
                    }
                    pnode = pnode->AsParseNodeBin()->pnode2;
                }
                byteCodeGenerator->SetCurrentTopStatement(pnode);
                Visit(pnode, byteCodeGenerator, prefix, postfix);

                EndVisitBlock(pnodeFnc->pnodeBodyScope, byteCodeGenerator);
                EndVisitBlock(pnodeFnc->pnodeScopes, byteCodeGenerator);
            }

            if (!pnodeFnc->pnodeBody)
            {
                // For defer prase scenario push the scopes here
                byteCodeGenerator->PushScope(funcInfo->GetParamScope());
                byteCodeGenerator->PushScope(funcInfo->GetBodyScope());
            }

            if (!parentFuncInfo->IsFakeGlobalFunction(byteCodeGenerator->GetFlags()))
            {
                pnodeFnc->nestedIndex = *pIndex;
                parentFunc->SetNestedFunc(funcInfo->byteCodeFunction->GetFunctionInfo(), (*pIndex)++, byteCodeGenerator->GetFlags());
            }

            Assert(parentFunc);

            parentFuncInfo->OnEndVisitFunction(pnodeFnc);

            PostVisitFunction(pnodeFnc, byteCodeGenerator);

            pnodeScope = pnodeFnc->pnodeNext;

            byteCodeGenerator->pCurrentFunction = pLastReuseFunc;
            break;
        }

        case knopBlock:
        {
            ParseNodeBlock * pnodeBlockScope = pnodeScope->AsParseNodeBlock();
            PreVisitBlock(pnodeBlockScope, byteCodeGenerator);
            bool isMergedScope;
            parentFuncInfo->OnStartVisitScope(pnodeBlockScope->scope, &isMergedScope);
            VisitNestedScopes(pnodeBlockScope->pnodeScopes, pnodeParent, byteCodeGenerator, prefix, postfix, pIndex);
            parentFuncInfo->OnEndVisitScope(pnodeBlockScope->scope, isMergedScope);
            PostVisitBlock(pnodeBlockScope, byteCodeGenerator);

            pnodeScope = pnodeScope->AsParseNodeBlock()->pnodeNext;
            break;
        }

        case knopCatch:
        {
            ParseNodeCatch * pnodeCatchScope = pnodeScope->AsParseNodeCatch();
            PreVisitCatch(pnodeCatchScope, byteCodeGenerator);

            if (pnodeCatchScope->HasParam() && !pnodeCatchScope->HasPatternParam())
            {
                Visit(pnodeCatchScope->GetParam(), byteCodeGenerator, prefix, postfix);
            }

            bool isMergedScope;
            parentFuncInfo->OnStartVisitScope(pnodeCatchScope->scope, &isMergedScope);
            VisitNestedScopes(pnodeCatchScope->pnodeScopes, pnodeParent, byteCodeGenerator, prefix, postfix, pIndex);

            parentFuncInfo->OnEndVisitScope(pnodeCatchScope->scope, isMergedScope);
            PostVisitCatch(pnodeCatchScope, byteCodeGenerator);

            pnodeScope = pnodeCatchScope->pnodeNext;
            break;
        }

        case knopWith:
        {
            PreVisitWith(pnodeScope, byteCodeGenerator);
            bool isMergedScope;
            parentFuncInfo->OnStartVisitScope(pnodeScope->AsParseNodeWith()->scope, &isMergedScope);
            VisitNestedScopes(pnodeScope->AsParseNodeWith()->pnodeScopes, pnodeParent, byteCodeGenerator, prefix, postfix, pIndex);
            parentFuncInfo->OnEndVisitScope(pnodeScope->AsParseNodeWith()->scope, isMergedScope);
            PostVisitWith(pnodeScope, byteCodeGenerator);
            pnodeScope = pnodeScope->AsParseNodeWith()->pnodeNext;
            break;
        }

        default:
            AssertMsg(false, "Unexpected opcode in tree of scopes");
            return;
        }
    }
}